

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O2

void skiwi::format_test_7(void)

{
  format_options ops;
  string res;
  allocator<char> local_2f9;
  allocator<char> local_2f8 [32];
  string local_2d8 [36];
  format_options local_2b4 [4];
  undefined4 local_2b0;
  anon_unknown_0 local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28 [32];
  
  skiwi::format_options::format_options(local_2b4);
  local_2b0 = 10;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,
             "(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))"
             ,local_2f8);
  skiwi::format(local_28,(format_options *)local_2d8);
  anon_unknown_0::cleanup(local_2a8,(EVP_PKEY_CTX *)local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "\n(define newton lambda\n  (guess function derivative epsilon)\n  (define guess2\n    (- guess\n      (/ (function guess)\n         (derivative guess))))\n  (if (< (abs\n           (- guess guess2))\n         epsilon)\n      guess2\n      (newton guess2 function derivative epsilon)))\n"
             ,(allocator<char> *)local_2d8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_48,(EVP_PKEY_CTX *)local_68);
  std::__cxx11::string::string((string *)&local_88,(string *)local_2a8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_48,&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xe6,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"(case (car \'(c d)) [(a) \'a] [(b) \'b])",&local_2f9);
  skiwi::format(local_a8,(format_options *)local_2f8);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2d8,(EVP_PKEY_CTX *)local_a8);
  std::__cxx11::string::operator=((string *)local_2a8,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,
             "\n(case (car\n        \'(c d))\n        [(a)\n         \'a]\n        [(b)\n         \'b])\n"
             ,(allocator<char> *)local_2d8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_c8,(EVP_PKEY_CTX *)local_e8);
  std::__cxx11::string::string((string *)&local_108,(string *)local_2a8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_c8,&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf0,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)",&local_2f9);
  skiwi::format(local_128,(format_options *)local_2f8);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2d8,(EVP_PKEY_CTX *)local_128);
  std::__cxx11::string::operator=((string *)local_2a8,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"\n(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)\n",
             (allocator<char> *)local_2d8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_148,(EVP_PKEY_CTX *)local_168);
  std::__cxx11::string::string((string *)&local_188,(string *)local_2a8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_148,&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf5,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"quote (\"Hello\" \"World\")",&local_2f9);
  skiwi::format(local_1a8,(format_options *)local_2f8);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2d8,(EVP_PKEY_CTX *)local_1a8);
  std::__cxx11::string::operator=((string *)local_2a8,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"\nquote (\"Hello\" \"World\")\n",(allocator<char> *)local_2d8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_1c8,(EVP_PKEY_CTX *)local_1e8);
  std::__cxx11::string::string((string *)&local_208,(string *)local_2a8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_1c8,&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xfa,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,
             "(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)"
             ,&local_2f9);
  skiwi::format(local_228,(format_options *)local_2f8);
  anon_unknown_0::cleanup((anon_unknown_0 *)local_2d8,(EVP_PKEY_CTX *)local_228);
  std::__cxx11::string::operator=((string *)local_2a8,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,
             "\n(letrec ([f (lambda\n              (i)\n              (when\n                (<= i 100000)\n                (let\n                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])\n                  (f (add1 i)))))])\n        (f 0)\n        100)\n"
             ,(allocator<char> *)local_2d8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_248,(EVP_PKEY_CTX *)local_268);
  std::__cxx11::string::string((string *)&local_288,(string *)local_2a8);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_248,&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x107,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string((string *)local_2a8);
  return;
}

Assistant:

void format_test_7()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))", ops));
  TEST_EQ(cleanup(R"(
(define newton lambda
  (guess function derivative epsilon)
  (define guess2
    (- guess
      (/ (function guess)
         (derivative guess))))
  (if (< (abs
           (- guess guess2))
         epsilon)
      guess2
      (newton guess2 function derivative epsilon)))
)"), res);

  res = cleanup(format("(case (car '(c d)) [(a) 'a] [(b) 'b])", ops));
  TEST_EQ(cleanup(R"(
(case (car
        '(c d))
        [(a)
         'a]
        [(b)
         'b])
)"), res);

  res = cleanup(format(R"((string #\j #\a #\n #\n #\e #\m #\a #\n))", ops));
  TEST_EQ(cleanup(R"(
(string #\j #\a #\n #\n #\e #\m #\a #\n)
)"), res);

  res = cleanup(format("quote (\"Hello\" \"World\")", ops));
  TEST_EQ(cleanup(R"(
quote ("Hello" "World")
)"), res);

  res = cleanup(format("(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)", ops));
  TEST_EQ(cleanup(R"(
(letrec ([f (lambda
              (i)
              (when
                (<= i 100000)
                (let
                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])
                  (f (add1 i)))))])
        (f 0)
        100)
)"), res);
  }